

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O0

lzma_ret lzma_stream_decoder_init
                   (lzma_next_coder_conflict1 *next,lzma_allocator *allocator,uint64_t memlimit,
                   uint32_t flags)

{
  lzma_coder_conflict1 *plVar1;
  uint32_t flags_local;
  uint64_t memlimit_local;
  lzma_allocator *allocator_local;
  lzma_next_coder_conflict1 *next_local;
  
  if ((code *)next->init != lzma_stream_decoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_stream_decoder_init;
  if (memlimit == 0) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else if ((flags & 0xfffffff0) == 0) {
    if (next->coder == (lzma_coder_conflict1 *)0x0) {
      plVar1 = (lzma_coder_conflict1 *)lzma_alloc(0x578,allocator);
      next->coder = plVar1;
      if (next->coder == (lzma_coder_conflict1 *)0x0) {
        return LZMA_MEM_ERROR;
      }
      next->code = stream_decode;
      next->end = stream_decoder_end;
      next->get_check = stream_decoder_get_check;
      next->memconfig = stream_decoder_memconfig;
      memcpy(&next->coder->block_decoder,&LZMA_NEXT_CODER_INIT,0x40);
      next->coder->index_hash = (lzma_index_hash *)0x0;
    }
    next->coder->memlimit = memlimit;
    next->coder->memusage = 0x8000;
    next->coder->tell_no_check = (flags & 1) != 0;
    next->coder->tell_unsupported_check = (flags & 2) != 0;
    next->coder->tell_any_check = (flags & 4) != 0;
    next->coder->concatenated = (flags & 8) != 0;
    next->coder->first_stream = true;
    next_local._4_4_ = stream_decoder_reset(next->coder,allocator);
  }
  else {
    next_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_stream_decoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		uint64_t memlimit, uint32_t flags)
{
	lzma_next_coder_init(&lzma_stream_decoder_init, next, allocator);

	if (memlimit == 0)
		return LZMA_PROG_ERROR;

	if (flags & ~LZMA_SUPPORTED_FLAGS)
		return LZMA_OPTIONS_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &stream_decode;
		next->end = &stream_decoder_end;
		next->get_check = &stream_decoder_get_check;
		next->memconfig = &stream_decoder_memconfig;

		next->coder->block_decoder = LZMA_NEXT_CODER_INIT;
		next->coder->index_hash = NULL;
	}

	next->coder->memlimit = memlimit;
	next->coder->memusage = LZMA_MEMUSAGE_BASE;
	next->coder->tell_no_check = (flags & LZMA_TELL_NO_CHECK) != 0;
	next->coder->tell_unsupported_check
			= (flags & LZMA_TELL_UNSUPPORTED_CHECK) != 0;
	next->coder->tell_any_check = (flags & LZMA_TELL_ANY_CHECK) != 0;
	next->coder->concatenated = (flags & LZMA_CONCATENATED) != 0;
	next->coder->first_stream = true;

	return stream_decoder_reset(next->coder, allocator);
}